

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
Line::generate_option
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Line *this,
          vector<int,_std::allocator<int>_> *position_indexes,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *possible_per_number)

{
  undefined8 uVar1;
  vector<bool,_std::allocator<bool>_> *pvVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  reference rVar8;
  vector<bool,_std::allocator<bool>_> option;
  allocator_type local_62;
  bool local_61;
  vector<bool,_std::allocator<bool>_> *local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_61 = false;
  local_60 = __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)this->m_size,&local_61,
             &local_62);
  piVar5 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0;
      p_Var4 = local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
      p_Var3 = local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
      pvVar2 = local_60,
      uVar6 < (ulong)((long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
      uVar6 = uVar6 + 1) {
    for (lVar7 = 0; (int)lVar7 < piVar5[uVar6]; lVar7 = lVar7 + 1) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_58,
                         *(int *)(*(long *)&(possible_per_number->
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data +
                                 (long)(position_indexes->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar6] * 4) + lVar7);
      *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
      piVar5 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  uVar1 = CONCAT44(local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                   _12_4_,local_58._M_impl.super__Bvector_impl_data._M_start.
                          super__Bit_iterator_base._M_offset);
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_58._M_impl.super__Bvector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  (local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = p_Var4;
  *(ulong *)&(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                _M_offset);
  local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = p_Var3;
  *(undefined8 *)
   &(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_offset = uVar1;
  local_58._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return pvVar2;
}

Assistant:

vector<bool>
Line::generate_option(const vector<int> &position_indexes, const vector<vector<int>> &possible_per_number) const {
    vector<bool> option(m_size, false);

    for (int i = 0; i < m_numbers.size(); i++) {
        for (int j = 0; j < m_numbers[i]; j++) option[possible_per_number[i][position_indexes[i]] + j] = true;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    for (auto &&tile : option) {
        output << (tile ? '1' : '0');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    return move(option);
}